

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

string * __thiscall BMP::getUmCode_abi_cxx11_(string *__return_storage_ptr__,BMP *this,int a,int n)

{
  char cVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer pcVar4;
  
  getBit_abi_cxx11_(__return_storage_ptr__,this,a);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar4 = pcVar2 + (__return_storage_ptr__->_M_string_length - 1);
  if (pcVar2 < pcVar4 && __return_storage_ptr__->_M_string_length != 0) {
    do {
      pcVar3 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar4;
      *pcVar4 = cVar1;
      pcVar4 = pcVar4 + -1;
      pcVar2 = pcVar3;
    } while (pcVar3 < pcVar4);
  }
  while (__return_storage_ptr__->_M_string_length != (long)n) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar4 = pcVar2 + ((long)n - 1);
  if (pcVar2 < pcVar4 && n != 0) {
    do {
      pcVar3 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar4;
      *pcVar4 = cVar1;
      pcVar4 = pcVar4 + -1;
      pcVar2 = pcVar3;
    } while (pcVar3 < pcVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BMP::getUmCode(int a, int n)
{
    using namespace std;

    string x = getBit( a );

    reverse( x.begin(), x.end() );

    while ( x.size() != n )
        x += '0';

    reverse( x.begin(), x.end() );

    return x;
}